

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaSmallVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>,_16UL>::resize
          (VmaSmallVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>,_16UL> *this,
          size_t newCount,bool freeMemory)

{
  VkMappedMemoryRange *pVVar1;
  VkMappedMemoryRange **__dest;
  byte in_DL;
  VkAllocationCallbacks *in_RSI;
  VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *in_RDI;
  size_t in_stack_00000008;
  undefined7 in_stack_00000010;
  
  if ((in_RSI < (VkAllocationCallbacks *)0x11) ||
     ((in_RDI->m_Allocator).m_pCallbacks < (VkAllocationCallbacks *)0x11)) {
    if ((in_RSI < (VkAllocationCallbacks *)0x11) ||
       ((VkAllocationCallbacks *)0x10 < (in_RDI->m_Allocator).m_pCallbacks)) {
      if ((in_RSI < (VkAllocationCallbacks *)0x11) &&
         ((VkAllocationCallbacks *)0x10 < (in_RDI->m_Allocator).m_pCallbacks)) {
        if (in_RSI != (VkAllocationCallbacks *)0x0) {
          __dest = &in_RDI->m_pArray;
          pVVar1 = VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::data
                             ((VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>
                               *)&in_RDI[0x14].m_pArray);
          memcpy(__dest,pVVar1,(long)in_RSI * 0x28);
        }
        VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::resize
                  ((VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *)
                   CONCAT17(freeMemory,in_stack_00000010),in_stack_00000008);
        if ((in_DL & 1) != 0) {
          VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::shrink_to_fit
                    (in_RDI);
        }
      }
    }
    else {
      VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::resize
                ((VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *)
                 CONCAT17(freeMemory,in_stack_00000010),in_stack_00000008);
      if ((in_RDI->m_Allocator).m_pCallbacks != (VkAllocationCallbacks *)0x0) {
        pVVar1 = VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::data
                           ((VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *
                            )&in_RDI[0x14].m_pArray);
        memcpy(pVVar1,&in_RDI->m_pArray,(long)(in_RDI->m_Allocator).m_pCallbacks * 0x28);
      }
    }
  }
  else {
    VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::resize
              ((VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *)
               CONCAT17(freeMemory,in_stack_00000010),in_stack_00000008);
    if ((in_DL & 1) != 0) {
      VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::shrink_to_fit(in_RDI);
    }
  }
  (in_RDI->m_Allocator).m_pCallbacks = in_RSI;
  return;
}

Assistant:

void VmaSmallVector<T, AllocatorT, N>::resize(size_t newCount, bool freeMemory)
{
    if (newCount > N && m_Count > N)
    {
        // Any direction, staying in m_DynamicArray
        m_DynamicArray.resize(newCount);
        if (freeMemory)
        {
            m_DynamicArray.shrink_to_fit();
        }
    }
    else if (newCount > N && m_Count <= N)
    {
        // Growing, moving from m_StaticArray to m_DynamicArray
        m_DynamicArray.resize(newCount);
        if (m_Count > 0)
        {
            memcpy(m_DynamicArray.data(), m_StaticArray, m_Count * sizeof(T));
        }
    }
    else if (newCount <= N && m_Count > N)
    {
        // Shrinking, moving from m_DynamicArray to m_StaticArray
        if (newCount > 0)
        {
            memcpy(m_StaticArray, m_DynamicArray.data(), newCount * sizeof(T));
        }
        m_DynamicArray.resize(0);
        if (freeMemory)
        {
            m_DynamicArray.shrink_to_fit();
        }
    }
    else
    {
        // Any direction, staying in m_StaticArray - nothing to do here
    }
    m_Count = newCount;
}